

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O1

void __thiscall R::R(R *this,Object *obj)

{
  uint __val;
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var4;
  uint uVar5;
  ulong uVar6;
  uint __len;
  uint uVar7;
  string __str;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  uVar7 = obj->referencesNum + 1;
  __val = -uVar7;
  if (0 < (int)uVar7) {
    __val = uVar7;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00102f24;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00102f24;
      }
      if (uVar5 < 10000) goto LAB_00102f24;
      uVar6 = uVar6 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_00102f24:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50 + (ulong)(uVar7 >> 0x1f)),__len,__val);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,GC::logger.name._M_dataplus._M_p,
                      GC::logger.name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"NEW Reference of object ",0x18);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Reference num: ",0x10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_50,local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  this->object = obj;
  obj->referencesNum = obj->referencesNum + 1;
  iVar2 = (*obj->_vptr_Object[2])(obj);
  if (*(long *)(CONCAT44(extraout_var,iVar2) + 0x28) != 0) {
    iVar2 = (*this->object->_vptr_Object[2])();
    for (p_Var4 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var_00,iVar2) + 0x18);
        p_Var4 != (_Rb_tree_node_base *)(CONCAT44(extraout_var_00,iVar2) + 8);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      *(int *)(*(long *)(p_Var4 + 1) + 8) = *(int *)(*(long *)(p_Var4 + 1) + 8) + 1;
    }
  }
  return;
}

Assistant:

R::R(Object* obj) {
	GC::logger.debug("NEW Reference of object ", obj, " Reference num: ", to_string(obj->referencesNum + 1));
	this->object = obj;
	this->object->referencesNum++;
	if (!this->object->getDepends().empty()) {
        for (auto dep : this->object->getDepends()) {
            dep->referencesNum++;
        }
	}
}